

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::FastHexToBuffer(int i,char *buffer)

{
  char *pcVar1;
  LogMessage *this;
  LogMessage *other;
  long in_RSI;
  uint in_EDI;
  int in_stack_0000000c;
  LogMessage *in_stack_00000010;
  char *p;
  char *in_stack_ffffffffffffff78;
  LogMessage *in_stack_ffffffffffffff80;
  LogMessage *in_stack_ffffffffffffff90;
  char *local_68;
  undefined1 local_48 [56];
  long local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  if ((int)in_EDI < 0) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff90,(LogLevel)((ulong)local_48 >> 0x20),
               (char *)in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    internal::LogMessage::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    this = internal::LogMessage::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    other = internal::LogMessage::operator<<(in_stack_00000010,in_stack_0000000c);
    internal::LogFinisher::operator=((LogFinisher *)this,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x43dfa7);
  }
  *(undefined1 *)(local_10 + 0x15) = 0;
  pcVar1 = (char *)(local_10 + 0x14);
  do {
    local_68 = pcVar1;
    *local_68 = FastHexToBuffer::hexdigits[(int)(local_4 & 0xf)];
    local_4 = (int)local_4 >> 4;
    pcVar1 = local_68 + -1;
  } while (0 < (int)local_4);
  return local_68;
}

Assistant:

char *FastHexToBuffer(int i, char* buffer) {
  GOOGLE_CHECK(i >= 0) << "FastHexToBuffer() wants non-negative integers, not " << i;

  static const char *hexdigits = "0123456789abcdef";
  char *p = buffer + 21;
  *p-- = '\0';
  do {
    *p-- = hexdigits[i & 15];   // mod by 16
    i >>= 4;                    // divide by 16
  } while (i > 0);
  return p + 1;
}